

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O3

_Bool Curl_check_noproxy(char *name,char *no_proxy,_Bool *spacesep)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  size_t __n;
  char cVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  uint uVar12;
  size_t sVar13;
  char *__src;
  long lVar14;
  uchar address_1 [16];
  char checkip [128];
  char hostip [128];
  size_t local_170;
  uint local_168 [4];
  uint local_158 [6];
  _Bool *local_140;
  char local_138 [128];
  char local_b8 [136];
  
  *spacesep = false;
  if (name == (char *)0x0) {
    return false;
  }
  if ((no_proxy != (char *)0x0 && *name != '\0') && (bVar1 = *no_proxy, bVar1 != 0)) {
    if (bVar1 == 0x2a) {
      iVar6 = -(uint)(byte)no_proxy[1];
    }
    else {
      iVar6 = 0x2a - (uint)bVar1;
    }
    if (iVar6 == 0) {
      return true;
    }
    if (*name == '[') {
      pcVar4 = strchr(name,0x5d);
      if (pcVar4 != (char *)0x0) {
        __src = name + 1;
        local_170 = (long)pcVar4 - (long)__src;
        if (local_170 < 0x80) {
          name = local_b8;
          memcpy(name,__src,local_170);
          local_b8[local_170] = '\0';
          cVar2 = '\x02';
          goto LAB_006a1c8b;
        }
      }
    }
    else {
      local_170 = strlen(name);
      iVar6 = inet_pton(2,name,local_b8);
      if (iVar6 != 1) {
        local_170 = local_170 - (name[local_170 - 1] == '.');
      }
      cVar2 = iVar6 == 1;
      bVar1 = *no_proxy;
      if (bVar1 != 0) {
LAB_006a1c8b:
        uVar5 = (ulong)bVar1;
        local_140 = spacesep;
LAB_006a1c9f:
        while ((cVar8 = (char)uVar5, cVar8 == '\t' || ((int)uVar5 == 0x20))) {
          pbVar11 = (byte *)no_proxy + 1;
          no_proxy = (char *)((byte *)no_proxy + 1);
          uVar5 = (ulong)*pbVar11;
        }
        pbVar11 = (byte *)no_proxy + -1;
        sVar13 = 0xffffffffffffffff;
        lVar14 = 0;
        while ((0x2c < (byte)uVar5 || ((0x100100000201U >> (uVar5 & 0x3f) & 1) == 0))) {
          lVar9 = sVar13 + 2;
          lVar14 = lVar14 + -1;
          sVar13 = sVar13 + 1;
          pbVar11 = pbVar11 + 1;
          uVar5 = (ulong)((byte *)no_proxy)[lVar9];
        }
        if (lVar14 == 0) goto LAB_006a1f07;
        __n = -lVar14;
        if (cVar2 == '\0') {
          if (((byte *)no_proxy)[sVar13] == 0x2e) {
            __n = sVar13;
          }
          pbVar10 = (byte *)no_proxy;
          if (__n == 0) {
            __n = 0;
          }
          else if (cVar8 == '.') {
            __n = __n - 1;
            pbVar10 = (byte *)no_proxy + 1;
          }
          lVar9 = local_170 - __n;
          uVar5 = local_170;
          pcVar4 = name;
          if (lVar9 != 0) {
            if ((local_170 < __n || lVar9 == 0) || (name[lVar9 + -1] != '.')) goto LAB_006a1f07;
            uVar5 = __n;
            pcVar4 = name + lVar9;
          }
          iVar6 = curl_strnequal((char *)pbVar10,pcVar4,uVar5);
          if (iVar6 != 0) {
            return true;
          }
          goto LAB_006a1f07;
        }
        if (0x7f < __n) goto LAB_006a1f07;
        memcpy(local_138,no_proxy,__n);
        local_138[sVar13 + 1] = '\0';
        pcVar4 = strchr(local_138,0x2f);
        if (pcVar4 == (char *)0x0) {
          if (cVar2 != '\x02') {
            uVar3 = 0;
            goto LAB_006a1ea6;
          }
LAB_006a1da2:
          uVar3 = 0x80;
        }
        else {
          uVar3 = atoi(pcVar4 + 1);
          *pcVar4 = '\0';
          if (cVar2 != '\x02') {
            local_158[0] = 0;
            local_168[0] = 0;
            if (0x20 < uVar3) goto LAB_006a1f07;
LAB_006a1ea6:
            local_158[0] = 0;
            local_168[0] = 0;
            iVar6 = inet_pton(2,name,local_158);
            if ((iVar6 == 1) && (iVar6 = inet_pton(2,local_138,local_168), iVar6 == 1)) {
              if ((uVar3 & 0x1f) == 0) {
                if (local_158[0] == local_168[0]) {
                  return true;
                }
              }
              else {
                uVar7 = local_168[0] ^ local_158[0];
                if ((uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18
                    ) >> (-(char)uVar3 & 0x1fU) == 0) {
                  return true;
                }
              }
            }
            goto LAB_006a1f07;
          }
          if (uVar3 == 0) goto LAB_006a1da2;
        }
        iVar6 = inet_pton(10,name,local_158);
        if (((iVar6 == 1) && (iVar6 = inet_pton(10,local_138,local_168), uVar3 < 0x88)) &&
           (iVar6 == 1)) {
          uVar12 = uVar3 >> 3;
          uVar7 = uVar3 & 7;
          if (((uVar12 != 0x10 || uVar7 == 0) &&
              ((uVar3 < 8 || (iVar6 = bcmp(local_158,local_168,(ulong)uVar12), iVar6 == 0)))) &&
             ((uVar7 == 0 ||
              ((byte)((*(byte *)((long)local_168 + (ulong)uVar12) ^
                      *(byte *)((long)local_158 + (ulong)uVar12)) >> (8U - (char)uVar7 & 0x1f)) != 0
              )))) {
            return true;
          }
        }
LAB_006a1f07:
        no_proxy = (char *)((byte *)no_proxy + -lVar14);
        do {
          bVar1 = *no_proxy;
          if (bVar1 < 0x20) {
            if (bVar1 != 9) goto LAB_006a1f27;
          }
          else if (bVar1 != 0x20) {
            if (bVar1 != 0x2c) goto LAB_006a1f42;
            goto LAB_006a1f32;
          }
          no_proxy = (char *)((byte *)no_proxy + 1);
          pbVar11 = pbVar11 + 1;
        } while( true );
      }
    }
  }
  return false;
LAB_006a1f27:
  if (bVar1 == 0) {
LAB_006a1f32:
    do {
      bVar1 = pbVar11[1];
      no_proxy = (char *)(pbVar11 + 1);
      pbVar11 = (byte *)no_proxy;
    } while (bVar1 == 0x2c);
  }
  else {
LAB_006a1f42:
    *local_140 = true;
    bVar1 = *no_proxy;
  }
  uVar5 = (ulong)bVar1;
  if (bVar1 == 0) {
    return false;
  }
  goto LAB_006a1c9f;
}

Assistant:

bool Curl_check_noproxy(const char *name, const char *no_proxy,
                        bool *spacesep)
{
  char hostip[128];
  *spacesep = FALSE;
  /*
   * If we don't have a hostname at all, like for example with a FILE
   * transfer, we have nothing to interrogate the noproxy list with.
   */
  if(!name || name[0] == '\0')
    return FALSE;

  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  if(no_proxy && no_proxy[0]) {
    const char *p = no_proxy;
    size_t namelen;
    enum nametype type = TYPE_HOST;
    if(!strcmp("*", no_proxy))
      return TRUE;

    /* NO_PROXY was specified and it wasn't just an asterisk */

    if(name[0] == '[') {
      char *endptr;
      /* IPv6 numerical address */
      endptr = strchr(name, ']');
      if(!endptr)
        return FALSE;
      name++;
      namelen = endptr - name;
      if(namelen >= sizeof(hostip))
        return FALSE;
      memcpy(hostip, name, namelen);
      hostip[namelen] = 0;
      name = hostip;
      type = TYPE_IPV6;
    }
    else {
      unsigned int address;
      namelen = strlen(name);
      if(1 == Curl_inet_pton(AF_INET, name, &address))
        type = TYPE_IPV4;
      else {
        /* ignore trailing dots in the host name */
        if(name[namelen - 1] == '.')
          namelen--;
      }
    }

    while(*p) {
      const char *token;
      size_t tokenlen = 0;
      bool match = FALSE;

      /* pass blanks */
      while(*p && ISBLANK(*p))
        p++;

      token = p;
      /* pass over the pattern */
      while(*p && !ISBLANK(*p) && (*p != ',')) {
        p++;
        tokenlen++;
      }

      if(tokenlen) {
        switch(type) {
        case TYPE_HOST:
          /* ignore trailing dots in the token to check */
          if(token[tokenlen - 1] == '.')
            tokenlen--;

          if(tokenlen && (*token == '.')) {
            /* ignore leading token dot as well */
            token++;
            tokenlen--;
          }
          /* A: example.com matches 'example.com'
             B: www.example.com matches 'example.com'
             C: nonexample.com DOES NOT match 'example.com'
          */
          if(tokenlen == namelen)
            /* case A, exact match */
            match = strncasecompare(token, name, namelen);
          else if(tokenlen < namelen) {
            /* case B, tailmatch domain */
            match = (name[namelen - tokenlen - 1] == '.') &&
              strncasecompare(token, name + (namelen - tokenlen),
                              tokenlen);
          }
          /* case C passes through, not a match */
          break;
        case TYPE_IPV4:
        case TYPE_IPV6: {
          const char *check = token;
          char *slash;
          unsigned int bits = 0;
          char checkip[128];
          if(tokenlen >= sizeof(checkip))
            /* this cannot match */
            break;
          /* copy the check name to a temp buffer */
          memcpy(checkip, check, tokenlen);
          checkip[tokenlen] = 0;
          check = checkip;

          slash = strchr(check, '/');
          /* if the slash is part of this token, use it */
          if(slash) {
            bits = atoi(slash + 1);
            *slash = 0; /* null terminate there */
          }
          if(type == TYPE_IPV6)
            match = Curl_cidr6_match(name, check, bits);
          else
            match = Curl_cidr4_match(name, check, bits);
          break;
        }
        }
        if(match)
          return TRUE;
      } /* if(tokenlen) */
      /* pass blanks after pattern */
      while(ISBLANK(*p))
        p++;
      /* if not a comma! */
      if(*p && (*p != ',')) {
        *spacesep = TRUE;
        continue;
      }
      /* pass any number of commas */
      while(*p == ',')
        p++;
    } /* while(*p) */
  } /* NO_PROXY was specified and it wasn't just an asterisk */

  return FALSE;
}